

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FormatString.hpp
# Opt level: O2

void Diligent::FormatStrSS<std::__cxx11::stringstream,std::__cxx11::string,char[8]>
               (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *ss,
               basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *FirstArg,
               char (*RestArgs) [8])

{
  std::operator<<((ostream *)(ss + 0x10),(string *)FirstArg);
  std::operator<<((ostream *)(ss + 0x10),*RestArgs);
  return;
}

Assistant:

void FormatStrSS(SSType& ss, const FirstArgType& FirstArg, const RestArgsType&... RestArgs)
{
    FormatStrSS(ss, FirstArg);
    FormatStrSS(ss, RestArgs...); // recursive call using pack expansion syntax
}